

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

void __thiscall
hrgls::Message::Message(Message *this,string *value,timeval time,hrgls_MessageLevel level)

{
  hrgls_Message phVar1;
  hrgls_Status hVar2;
  int iVar3;
  Message_private *this_00;
  undefined8 uVar4;
  hrgls_Message phStack_38;
  hrgls_Status s;
  hrgls_Message obj;
  string *psStack_28;
  hrgls_MessageLevel level_local;
  string *value_local;
  Message *this_local;
  timeval time_local;
  
  time_local.tv_sec = time.tv_usec;
  this_local = (Message *)time.tv_sec;
  this->m_private = (Message_private *)0x0;
  obj._4_4_ = level;
  psStack_28 = value;
  value_local = (string *)this;
  this_00 = (Message_private *)operator_new(0x10);
  Message_private::Message_private(this_00);
  this->m_private = this_00;
  hVar2 = hrgls_MessageCreate(&stack0xffffffffffffffc8);
  this->m_private->status = hVar2;
  this->m_private->Message = phStack_38;
  phVar1 = this->m_private->Message;
  uVar4 = std::__cxx11::string::c_str();
  iVar3 = hrgls_MessageSetValue(phVar1,uVar4);
  if (iVar3 != 0) {
    this->m_private->status = iVar3;
  }
  iVar3 = hrgls_MessageSetTimeStamp(this->m_private->Message,this_local,time_local.tv_sec);
  if (iVar3 != 0) {
    this->m_private->status = iVar3;
  }
  iVar3 = hrgls_MessageSetLevel(this->m_private->Message,obj._4_4_);
  if (iVar3 != 0) {
    this->m_private->status = iVar3;
  }
  return;
}

Assistant:

Message::Message(::std::string value, struct timeval time,
	  hrgls_MessageLevel level)
  {
    m_private = new Message_private;
    hrgls_Message obj;
    m_private->status = hrgls_MessageCreate(&obj);
    m_private->Message = obj;
  	hrgls_Status s = hrgls_STATUS_OKAY;
	  s = hrgls_MessageSetValue(m_private->Message, value.c_str());
	  if (s != hrgls_STATUS_OKAY) {
		  m_private->status = s;
	  }
	  s = hrgls_MessageSetTimeStamp(m_private->Message, time);
	  if (s != hrgls_STATUS_OKAY) {
		  m_private->status = s;
	  }
	  s = hrgls_MessageSetLevel(m_private->Message, level);
	  if (s != hrgls_STATUS_OKAY) {
		  m_private->status = s;
	  }
  }